

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_ecdsa_edge_cases(void)

{
  secp256k1_context *psVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  uchar *noncedata;
  uint64_t *puVar5;
  secp256k1_gej *psVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int32_t _calls_to_callback_9;
  secp256k1_scalar sr;
  secp256k1_scalar ss;
  secp256k1_scalar ss_2;
  secp256k1_scalar msg;
  secp256k1_ecdsa_signature sig;
  size_t siglen;
  secp256k1_gej keyj;
  uint64_t local_2038 [1025];
  
  ss.d[0]._0_1_ = 1;
  ss.d[0]._1_7_ = 0;
  ss.d[1] = 0;
  ss.d[2] = 0;
  ss.d[3]._0_7_ = 0;
  ss.d[3]._7_1_ = 0;
  secp256k1_scalar_negate(&ss,&ss);
  secp256k1_scalar_inverse(&ss,&ss);
  sr.d[0]._0_4_ = 1;
  sr.d[0]._4_4_ = 0;
  sr.d[1]._0_4_ = 0;
  sr.d[1]._4_4_ = 0;
  sr.d[2]._0_4_ = 0;
  sr.d[2]._4_4_ = 0;
  sr.d[3]._0_4_ = 0;
  sr.d[3]._4_4_ = 0;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&keyj,&sr);
  secp256k1_ge_set_gej((secp256k1_ge *)&sig,&keyj);
  msg.d[3] = CONCAT17(ss.d[3]._7_1_,(undefined7)ss.d[3]);
  msg.d[2] = ss.d[2];
  msg.d[0]._0_4_ = (int)CONCAT71(ss.d[0]._1_7_,(undefined1)ss.d[0]);
  msg.d[0]._4_4_ = (undefined4)((uint7)ss.d[0]._1_7_ >> 0x18);
  msg.d[1] = ss.d[1];
  iVar2 = secp256k1_ecdsa_sig_verify(&sr,&ss,(secp256k1_ge *)&sig,&msg);
  if (iVar2 == 0) {
    sr.d[0]._0_4_ = 1;
    sr.d[0]._4_4_ = 0;
    sr.d[1]._0_4_ = 0;
    sr.d[1]._4_4_ = 0;
    sr.d[2]._0_4_ = 0;
    sr.d[2]._4_4_ = 0;
    sr.d[3]._0_4_ = 0;
    sr.d[3]._4_4_ = 0;
    sig.data[0] = '\0';
    sig.data[1] = '\0';
    sig.data[2] = '\0';
    sig.data[3] = '\0';
    sig.data[4] = '\0';
    sig.data[5] = '\0';
    sig.data[6] = '\0';
    sig.data[7] = '\0';
    sig.data[8] = '\0';
    sig.data[9] = '\0';
    sig.data[10] = '\0';
    sig.data[0xb] = '\0';
    sig.data[0xc] = '\0';
    sig.data[0xd] = '\0';
    sig.data[0xe] = '\0';
    sig.data[0xf] = '\0';
    sig.data[0x10] = '\0';
    sig.data[0x11] = '\0';
    sig.data[0x12] = '\0';
    sig.data[0x13] = '\0';
    sig.data[0x14] = '\0';
    sig.data[0x15] = '\0';
    sig.data[0x16] = '\0';
    sig.data[0x17] = '\0';
    sig.data[0x18] = '\0';
    sig.data[0x19] = '\0';
    sig.data[0x1a] = '\0';
    sig.data[0x1b] = '\0';
    sig.data[0x1c] = '\0';
    sig.data[0x1d] = '\0';
    sig.data[0x1e] = '\0';
    sig.data[0x1f] = '\0';
    msg.d[0]._0_4_ = 0;
    msg.d[0]._4_4_ = 0;
    msg.d[1] = 0;
    msg.d[2] = 0;
    msg.d[3] = 0;
    iVar2 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)&keyj,&DAT_00153f00,0x21);
    if (iVar2 == 0) {
      pcVar7 = "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33)";
      uVar4 = 0x1bb1;
    }
    else {
      iVar2 = secp256k1_ecdsa_sig_verify(&msg,&sr,(secp256k1_ge *)&keyj,(secp256k1_scalar *)&sig);
      if (iVar2 == 0) {
        sig.data[1] = '\0';
        sig.data[2] = '\0';
        sig.data[3] = '\0';
        sig.data[4] = '\0';
        sig.data[5] = '\0';
        sig.data[6] = '\0';
        sig.data[7] = '\0';
        sig.data[8] = '\0';
        sig.data[9] = '\0';
        sig.data[10] = '\0';
        sig.data[0xb] = '\0';
        sig.data[0xc] = '\0';
        sig.data[0xd] = '\0';
        sig.data[0xe] = '\0';
        sig.data[0xf] = '\0';
        sig.data[0x10] = '\0';
        sig.data[0x11] = '\0';
        sig.data[0x12] = '\0';
        sig.data[0x13] = '\0';
        sig.data[0x14] = '\0';
        sig.data[0x15] = '\0';
        sig.data[0x16] = '\0';
        sig.data[0x17] = '\0';
        sig.data[0x18] = '\0';
        sig.data[0x19] = '\0';
        sig.data[0x1a] = '\0';
        sig.data[0x1b] = '\0';
        sig.data[0x1c] = '\0';
        sig.data[0x1d] = '\0';
        sig.data[0x1e] = '\0';
        sig.data[0x1f] = '\0';
        sig.data[0] = '\x02';
        sig.data[0x20] = '\x01';
        ss.d[2] = 0;
        ss.d[3]._0_7_ = 0;
        ss.d[3]._7_1_ = 0;
        ss.d[0]._0_1_ = 0;
        ss.d[0]._1_7_ = 0;
        ss.d[1] = 0;
        msg.d[0]._0_4_ = 0;
        msg.d[0]._4_4_ = 0;
        msg.d[1] = 0;
        msg.d[2] = 0;
        msg.d[3] = 0;
        sr.d[0]._0_4_ = 1;
        sr.d[0]._4_4_ = 0;
        sr.d[1]._0_4_ = 0;
        sr.d[1]._4_4_ = 0;
        sr.d[2]._0_4_ = 0;
        sr.d[2]._4_4_ = 0;
        sr.d[3]._0_4_ = 0;
        sr.d[3]._4_4_ = 0;
        iVar2 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)&keyj,sig.data,0x21);
        if (iVar2 == 0) {
          pcVar7 = "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)";
          uVar4 = 0x1bc4;
        }
        else {
          iVar2 = secp256k1_ecdsa_sig_verify(&sr,&ss,(secp256k1_ge *)&keyj,&msg);
          if (iVar2 == 0) {
            msg.d[0]._4_4_ = 0;
            msg.d[1] = 0;
            msg.d[2] = 0;
            msg.d[3] = 0;
            msg.d[0]._0_4_ = 2;
            ss_2.d[0] = 2;
            ss_2.d[3] = 0;
            ss_2.d[1] = 0;
            ss_2.d[2] = 0;
            sr.d[0]._0_4_ = 0;
            sr.d[0]._4_4_ = 0;
            sr.d[1]._0_4_ = 0;
            sr.d[1]._4_4_ = 0;
            sr.d[2]._0_4_ = 0;
            sr.d[2]._4_4_ = 0;
            sr.d[3]._0_4_ = 0;
            sr.d[3]._4_4_ = 0;
            ss.d[0]._0_1_ = 2;
            ss.d[0]._1_7_ = 0;
            ss.d[1] = 0;
            ss.d[2] = 0;
            ss.d[3]._0_7_ = 0;
            ss.d[3]._7_1_ = 0;
            iVar2 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)&keyj,(uchar *)&msg,0x21);
            if (iVar2 == 0) {
              pcVar7 = "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)";
              uVar4 = 0x1bdf;
            }
            else {
              iVar2 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)&sig,&DAT_00153f30,0x21);
              if (iVar2 == 0) {
                pcVar7 = "test condition failed: secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33)";
                uVar4 = 0x1be0;
              }
              else {
                iVar2 = secp256k1_ecdsa_sig_verify(&ss,&ss_2,(secp256k1_ge *)&keyj,&sr);
                if (iVar2 == 0) {
                  pcVar7 = 
                  "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1";
                  uVar4 = 0x1be1;
                }
                else {
                  iVar2 = secp256k1_ecdsa_sig_verify(&ss,&ss_2,(secp256k1_ge *)&sig,&sr);
                  if (iVar2 == 0) {
                    pcVar7 = 
                    "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1";
                    uVar4 = 0x1be2;
                  }
                  else {
                    secp256k1_scalar_negate(&ss_2,&ss_2);
                    iVar2 = secp256k1_ecdsa_sig_verify(&ss,&ss_2,(secp256k1_ge *)&keyj,&sr);
                    if (iVar2 == 0) {
                      pcVar7 = 
                      "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1"
                      ;
                      uVar4 = 0x1be4;
                    }
                    else {
                      iVar2 = secp256k1_ecdsa_sig_verify(&ss,&ss_2,(secp256k1_ge *)&sig,&sr);
                      if (iVar2 == 0) {
                        pcVar7 = 
                        "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1"
                        ;
                        uVar4 = 0x1be5;
                      }
                      else {
                        ss_2.d[0] = 1;
                        ss_2.d[1] = 0;
                        ss_2.d[2] = 0;
                        ss_2.d[3] = 0;
                        iVar2 = secp256k1_ecdsa_sig_verify(&ss,&ss_2,(secp256k1_ge *)&keyj,&sr);
                        if (iVar2 == 0) {
                          iVar2 = secp256k1_ecdsa_sig_verify(&ss,&ss_2,(secp256k1_ge *)&sig,&sr);
                          if (iVar2 == 0) {
                            ss.d[0]._0_1_ = 1;
                            ss.d[0]._1_7_ = 0;
                            ss.d[1] = 0;
                            ss.d[2] = 0;
                            ss.d[3]._0_7_ = 0;
                            ss.d[3]._7_1_ = 0;
                            msg.d[0]._0_4_ = 1;
                            msg.d[0]._4_4_ = 0;
                            msg.d[1] = 0;
                            msg.d[2] = 0;
                            msg.d[3] = 0;
                            secp256k1_scalar_set_b32(&sr,"",(int *)0x0);
                            iVar2 = secp256k1_eckey_pubkey_parse
                                              ((secp256k1_ge *)&keyj,&DAT_00153f60,0x21);
                            if (iVar2 == 0) {
                              pcVar7 = 
                              "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)"
                              ;
                              uVar4 = 0x1c08;
                            }
                            else {
                              iVar2 = secp256k1_eckey_pubkey_parse
                                                ((secp256k1_ge *)&sig,&DAT_00153f90,0x21);
                              if (iVar2 == 0) {
                                pcVar7 = 
                                "test condition failed: secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33)"
                                ;
                                uVar4 = 0x1c09;
                              }
                              else {
                                iVar2 = secp256k1_ecdsa_sig_verify
                                                  (&sr,&ss,(secp256k1_ge *)&keyj,&msg);
                                if (iVar2 == 0) {
                                  pcVar7 = 
                                  "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1"
                                  ;
                                  uVar4 = 0x1c0a;
                                }
                                else {
                                  iVar2 = secp256k1_ecdsa_sig_verify
                                                    (&sr,&ss,(secp256k1_ge *)&sig,&msg);
                                  if (iVar2 == 0) {
                                    pcVar7 = 
                                    "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1"
                                    ;
                                    uVar4 = 0x1c0b;
                                  }
                                  else {
                                    secp256k1_scalar_negate(&ss,&ss);
                                    iVar2 = secp256k1_ecdsa_sig_verify
                                                      (&sr,&ss,(secp256k1_ge *)&keyj,&msg);
                                    if (iVar2 == 0) {
                                      pcVar7 = 
                                      "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1"
                                      ;
                                      uVar4 = 0x1c0d;
                                    }
                                    else {
                                      iVar2 = secp256k1_ecdsa_sig_verify
                                                        (&sr,&ss,(secp256k1_ge *)&sig,&msg);
                                      if (iVar2 == 0) {
                                        pcVar7 = 
                                        "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1"
                                        ;
                                        uVar4 = 0x1c0e;
                                      }
                                      else {
                                        ss.d[0]._0_1_ = 2;
                                        ss.d[0]._1_7_ = 0;
                                        ss.d[1] = 0;
                                        ss.d[2] = 0;
                                        ss.d[3]._0_7_ = 0;
                                        ss.d[3]._7_1_ = 0;
                                        secp256k1_scalar_inverse_var(&ss,&ss);
                                        iVar2 = secp256k1_ecdsa_sig_verify
                                                          (&sr,&ss,(secp256k1_ge *)&keyj,&msg);
                                        if (iVar2 == 0) {
                                          iVar2 = secp256k1_ecdsa_sig_verify
                                                            (&sr,&ss,(secp256k1_ge *)&sig,&msg);
                                          if (iVar2 == 0) {
                                            sr.d[0]._0_4_ = 1;
                                            sr.d[0]._4_4_ = 0;
                                            sr.d[3]._0_4_ = 0;
                                            sr.d[3]._4_4_ = 0;
                                            sr.d[1]._0_4_ = 0;
                                            sr.d[1]._4_4_ = 0;
                                            sr.d[2]._0_4_ = 0;
                                            sr.d[2]._4_4_ = 0;
                                            sig.data[0] = '\x01';
                                            sig.data[1] = '\0';
                                            sig.data[2] = '\0';
                                            sig.data[3] = '\0';
                                            sig.data[4] = '\0';
                                            sig.data[5] = '\0';
                                            sig.data[6] = '\0';
                                            sig.data[7] = '\0';
                                            sig.data[8] = '\0';
                                            sig.data[9] = '\0';
                                            sig.data[10] = '\0';
                                            sig.data[0xb] = '\0';
                                            sig.data[0xc] = '\0';
                                            sig.data[0xd] = '\0';
                                            sig.data[0xe] = '\0';
                                            sig.data[0xf] = '\0';
                                            sig.data[0x10] = '\0';
                                            sig.data[0x11] = '\0';
                                            sig.data[0x12] = '\0';
                                            sig.data[0x13] = '\0';
                                            sig.data[0x14] = '\0';
                                            sig.data[0x15] = '\0';
                                            sig.data[0x16] = '\0';
                                            sig.data[0x17] = '\0';
                                            sig.data[0x18] = '\0';
                                            sig.data[0x19] = '\0';
                                            sig.data[0x1a] = '\0';
                                            sig.data[0x1b] = '\0';
                                            sig.data[0x1c] = '\0';
                                            sig.data[0x1d] = '\0';
                                            sig.data[0x1e] = '\0';
                                            sig.data[0x1f] = '\0';
                                            secp256k1_scalar_negate
                                                      ((secp256k1_scalar *)&sig,
                                                       (secp256k1_scalar *)&sig);
                                            secp256k1_scalar_set_b32(&msg,"",(int *)0x0);
                                            iVar2 = secp256k1_eckey_pubkey_parse
                                                              ((secp256k1_ge *)&keyj,&DAT_00153fc0,
                                                               0x21);
                                            if (iVar2 == 0) {
                                              pcVar7 = 
                                              "test condition failed: secp256k1_eckey_pubkey_parse(&key, pubkey, 33)"
                                              ;
                                              uVar4 = 0x1c2b;
                                            }
                                            else {
                                              iVar2 = secp256k1_ecdsa_sig_verify
                                                                (&msg,&sr,(secp256k1_ge *)&keyj,
                                                                 (secp256k1_scalar *)&sig);
                                              if (iVar2 == 0) {
                                                pcVar7 = 
                                                "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1"
                                                ;
                                                uVar4 = 0x1c2c;
                                              }
                                              else {
                                                secp256k1_scalar_negate(&sr,&sr);
                                                iVar2 = secp256k1_ecdsa_sig_verify
                                                                  (&msg,&sr,(secp256k1_ge *)&keyj,
                                                                   (secp256k1_scalar *)&sig);
                                                if (iVar2 == 0) {
                                                  pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1"
                                                  ;
                                                  uVar4 = 0x1c2e;
                                                }
                                                else {
                                                  sr.d[0]._0_4_ = 3;
                                                  sr.d[0]._4_4_ = 0;
                                                  sr.d[1]._0_4_ = 0;
                                                  sr.d[1]._4_4_ = 0;
                                                  sr.d[2]._0_4_ = 0;
                                                  sr.d[2]._4_4_ = 0;
                                                  sr.d[3]._0_4_ = 0;
                                                  sr.d[3]._4_4_ = 0;
                                                  secp256k1_scalar_inverse_var(&sr,&sr);
                                                  iVar2 = secp256k1_ecdsa_sig_verify
                                                                    (&msg,&sr,(secp256k1_ge *)&keyj,
                                                                     (secp256k1_scalar *)&sig);
                                                  if (iVar2 == 0) {
                                                    sr.d[2]._0_4_ = 0;
                                                    sr.d[2]._4_4_ = 0;
                                                    sr.d[3]._0_4_ = 0;
                                                    sr.d[3]._4_4_ = 0x1000000;
                                                    sr.d[0]._0_4_ = 0;
                                                    sr.d[0]._4_4_ = 0;
                                                    sr.d[1]._0_4_ = 0;
                                                    sr.d[1]._4_4_ = 0;
                                                    ss.d[2] = 0x62777a810be012b8;
                                                    ss.d[3]._0_7_ = 0x293eb931dddf65;
                                                    ss.d[3]._7_1_ = 0xa9;
                                                    ss.d[0]._0_1_ = 0x86;
                                                    ss.d[0]._1_7_ = 0x53442306819941;
                                                    ss.d[1] = 0xf7f478316a9d5faa;
                                                    iVar2 = secp256k1_ecdsa_sign
                                                                      (CTX,&sig,(uchar *)&ss,
                                                                       (uchar *)&sr,
                                                                       precomputed_nonce_function,""
                                                                      );
                                                    if (iVar2 == 0) {
                                                      iVar2 = secp256k1_ecdsa_sign
                                                                        (CTX,&sig,(uchar *)&ss,
                                                                         (uchar *)&sr,
                                                                         precomputed_nonce_function,
                                                                         test_ecdsa_edge_cases::
                                                                         nonce2);
                                                      if (iVar2 == 0) {
                                                        ss.d[3]._7_1_ = 0xaa;
                                                        iVar2 = secp256k1_ecdsa_sign
                                                                          (CTX,&sig,(uchar *)&ss,
                                                                           (uchar *)&sr,
                                                                                                                                                      
                                                  precomputed_nonce_function,"");
                                                  if (iVar2 == 1) {
                                                    msg.d[0]._0_4_ = 0;
                                                    keyj.x.n[0] = (uint64_t)
                                                                  (CTX->illegal_callback).fn;
                                                    keyj.x.n[1] = (uint64_t)
                                                                  (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&msg);
                                                    iVar2 = secp256k1_ecdsa_sign
                                                                      (CTX,(
                                                  secp256k1_ecdsa_signature *)0x0,(uchar *)&ss,
                                                  (uchar *)&sr,precomputed_nonce_function,
                                                  test_ecdsa_edge_cases::nonce2);
                                                  psVar1 = CTX;
                                                  if (iVar2 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)keyj.x.n[0]
                                                    ;
                                                    (psVar1->illegal_callback).data =
                                                         (void *)keyj.x.n[1];
                                                    if ((int)msg.d[0] == 1) {
                                                      msg.d[0]._0_4_ = 0;
                                                      keyj.x.n[0] = (uint64_t)
                                                                    (psVar1->illegal_callback).fn;
                                                      keyj.x.n[1] = (uint64_t)
                                                                    (psVar1->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar1,counting_callback_fn,&msg);
                                                      iVar2 = secp256k1_ecdsa_sign
                                                                        (CTX,&sig,(uchar *)0x0,
                                                                         (uchar *)&sr,
                                                                         precomputed_nonce_function,
                                                                         test_ecdsa_edge_cases::
                                                                         nonce2);
                                                      psVar1 = CTX;
                                                      if (iVar2 == 0) {
                                                        (CTX->illegal_callback).fn =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             keyj.x.n[0];
                                                        (psVar1->illegal_callback).data =
                                                             (void *)keyj.x.n[1];
                                                        if ((int)msg.d[0] == 1) {
                                                          msg.d[0]._0_4_ = 0;
                                                          keyj.x.n[0] = (uint64_t)
                                                                        (psVar1->illegal_callback).
                                                                        fn;
                                                          keyj.x.n[1] = (uint64_t)
                                                                        (psVar1->illegal_callback).
                                                                        data;
                                                          secp256k1_context_set_illegal_callback
                                                                    (psVar1,counting_callback_fn,
                                                                     &msg);
                                                          iVar2 = secp256k1_ecdsa_sign
                                                                            (CTX,&sig,(uchar *)&ss,
                                                                             (uchar *)0x0,
                                                                                                                                                          
                                                  precomputed_nonce_function,
                                                  test_ecdsa_edge_cases::nonce2);
                                                  psVar1 = CTX;
                                                  if (iVar2 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)keyj.x.n[0]
                                                    ;
                                                    (psVar1->illegal_callback).data =
                                                         (void *)keyj.x.n[1];
                                                    if ((int)msg.d[0] == 1) {
                                                      iVar2 = secp256k1_ecdsa_sign
                                                                        (psVar1,&sig,(uchar *)&ss,
                                                                         (uchar *)&sr,
                                                                         precomputed_nonce_function,
                                                                         test_ecdsa_edge_cases::
                                                                         nonce2);
                                                      if (iVar2 == 1) {
                                                        iVar2 = secp256k1_ec_pubkey_create
                                                                          (CTX,(secp256k1_pubkey *)
                                                                               &msg,(uchar *)&sr);
                                                        if (iVar2 == 0) {
                                                          pcVar7 = 
                                                  "test condition failed: secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1"
                                                  ;
                                                  uVar4 = 0x1c59;
                                                  }
                                                  else {
                                                    ss_2.d[0] = ss_2.d[0] & 0xffffffff00000000;
                                                    keyj.x.n[0] = (uint64_t)
                                                                  (CTX->illegal_callback).fn;
                                                    keyj.x.n[1] = (uint64_t)
                                                                  (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&ss_2);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("sig != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar1 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)keyj.x.n[0]
                                                    ;
                                                    (psVar1->illegal_callback).data =
                                                         (void *)keyj.x.n[1];
                                                    if ((int)ss_2.d[0] == 1) {
                                                      ss_2.d[0] = ss_2.d[0] & 0xffffffff00000000;
                                                      keyj.x.n[0] = (uint64_t)
                                                                    (psVar1->illegal_callback).fn;
                                                      keyj.x.n[1] = (uint64_t)
                                                                    (psVar1->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar1,counting_callback_fn,&ss_2);
                                                      (*(CTX->illegal_callback).fn)
                                                                ("msghash32 != NULL",
                                                                 (CTX->illegal_callback).data);
                                                      psVar1 = CTX;
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           keyj.x.n[0];
                                                      (psVar1->illegal_callback).data =
                                                           (void *)keyj.x.n[1];
                                                      if ((int)ss_2.d[0] == 1) {
                                                        ss_2.d[0] = ss_2.d[0] & 0xffffffff00000000;
                                                        keyj.x.n[0] = (uint64_t)
                                                                      (psVar1->illegal_callback).fn;
                                                        keyj.x.n[1] = (uint64_t)
                                                                      (psVar1->illegal_callback).
                                                                      data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar1,counting_callback_fn,&ss_2
                                                                  );
                                                        (*(CTX->illegal_callback).fn)
                                                                  ("pubkey != NULL",
                                                                   (CTX->illegal_callback).data);
                                                        psVar1 = CTX;
                                                        (CTX->illegal_callback).fn =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             keyj.x.n[0];
                                                        (psVar1->illegal_callback).data =
                                                             (void *)keyj.x.n[1];
                                                        if ((int)ss_2.d[0] == 1) {
                                                          iVar2 = secp256k1_ecdsa_verify
                                                                            (psVar1,&sig,
                                                                             (uchar *)&ss,
                                                                             (secp256k1_pubkey *)
                                                                             &msg);
                                                          if (iVar2 == 0) {
                                                            pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1"
                                                  ;
                                                  uVar4 = 0x1c5d;
                                                  }
                                                  else {
                                                    ss_2.d[0] = ss_2.d[0] & 0xffffffff00000000;
                                                    keyj.x.n[0] = (uint64_t)
                                                                  (CTX->illegal_callback).fn;
                                                    keyj.x.n[1] = (uint64_t)
                                                                  (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,&ss_2);
                                                    iVar2 = secp256k1_ec_pubkey_create
                                                                      (CTX,(secp256k1_pubkey *)&msg,
                                                                       (uchar *)0x0);
                                                    psVar1 = CTX;
                                                    if (iVar2 == 0) {
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)
                                                           keyj.x.n[0];
                                                      (psVar1->illegal_callback).data =
                                                           (void *)keyj.x.n[1];
                                                      if ((int)ss_2.d[0] == 1) {
                                                        ss_2.d[0] = ss_2.d[0] & 0xffffffff00000000;
                                                        keyj.x.n[0] = (uint64_t)
                                                                      (psVar1->illegal_callback).fn;
                                                        keyj.x.n[1] = (uint64_t)
                                                                      (psVar1->illegal_callback).
                                                                      data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar1,counting_callback_fn,&ss_2
                                                                  );
                                                        iVar2 = secp256k1_ecdsa_verify
                                                                          (CTX,&sig,(uchar *)&ss,
                                                                           (secp256k1_pubkey *)&msg)
                                                        ;
                                                        psVar1 = CTX;
                                                        if (iVar2 == 0) {
                                                          (CTX->illegal_callback).fn =
                                                               (_func_void_char_ptr_void_ptr *)
                                                               keyj.x.n[0];
                                                          (psVar1->illegal_callback).data =
                                                               (void *)keyj.x.n[1];
                                                          if ((int)ss_2.d[0] == 1) {
                                                            ss_2.d[0] = ss_2.d[0] &
                                                                        0xffffffff00000000;
                                                            siglen = 0x48;
                                                            keyj.x.n[0] = (uint64_t)
                                                                          (psVar1->illegal_callback)
                                                                          .fn;
                                                            keyj.x.n[1] = (uint64_t)
                                                                          (psVar1->illegal_callback)
                                                                          .data;
                                                            secp256k1_context_set_illegal_callback
                                                                      (psVar1,counting_callback_fn,
                                                                       &ss_2);
                                                            iVar2 = 
                                                  secp256k1_ecdsa_signature_serialize_der
                                                            (CTX,(uchar *)0x0,&siglen,&sig);
                                                  psVar1 = CTX;
                                                  if (iVar2 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)keyj.x.n[0]
                                                    ;
                                                    (psVar1->illegal_callback).data =
                                                         (void *)keyj.x.n[1];
                                                    if ((int)ss_2.d[0] == 1) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_2.d[0] = (uint64_t)
                                                                  (psVar1->illegal_callback).fn;
                                                      ss_2.d[1] = (uint64_t)
                                                                  (psVar1->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar1,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      iVar2 = 
                                                  secp256k1_ecdsa_signature_serialize_der
                                                            (CTX,(uchar *)&keyj,(size_t *)0x0,&sig);
                                                  psVar1 = CTX;
                                                  if (iVar2 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_2.d[0];
                                                    (psVar1->illegal_callback).data =
                                                         (void *)ss_2.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_2.d[0] = (uint64_t)
                                                                  (psVar1->illegal_callback).fn;
                                                      ss_2.d[1] = (uint64_t)
                                                                  (psVar1->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar1,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      iVar2 = 
                                                  secp256k1_ecdsa_signature_serialize_der
                                                            (CTX,(uchar *)&keyj,&siglen,
                                                             (secp256k1_ecdsa_signature *)0x0);
                                                  psVar1 = CTX;
                                                  if (iVar2 == 0) {
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_2.d[0];
                                                    (psVar1->illegal_callback).data =
                                                         (void *)ss_2.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      iVar2 = 
                                                  secp256k1_ecdsa_signature_serialize_der
                                                            (psVar1,(uchar *)&keyj,&siglen,&sig);
                                                  if (iVar2 == 0) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1"
                                                  ;
                                                  uVar4 = 0x1c65;
                                                  }
                                                  else {
                                                    __calls_to_callback_9 =
                                                         __calls_to_callback_9 & 0xffffffff00000000;
                                                    ss_2.d[0] = (uint64_t)(CTX->illegal_callback).fn
                                                    ;
                                                    ss_2.d[1] = (uint64_t)
                                                                (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &_calls_to_callback_9);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("sig != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar1 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_2.d[0];
                                                    (psVar1->illegal_callback).data =
                                                         (void *)ss_2.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_2.d[0] = (uint64_t)
                                                                  (psVar1->illegal_callback).fn;
                                                      ss_2.d[1] = (uint64_t)
                                                                  (psVar1->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar1,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      (*(CTX->illegal_callback).fn)
                                                                ("input != NULL",
                                                                 (CTX->illegal_callback).data);
                                                      psVar1 = CTX;
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)ss_2.d[0]
                                                      ;
                                                      (psVar1->illegal_callback).data =
                                                           (void *)ss_2.d[1];
                                                      if (_calls_to_callback_9 == 1) {
                                                        iVar2 = secp256k1_ecdsa_signature_parse_der
                                                                          (psVar1,&sig,
                                                                           (uchar *)&keyj,siglen);
                                                        if (iVar2 == 0) {
                                                          pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1"
                                                  ;
                                                  uVar4 = 0x1c68;
                                                  }
                                                  else {
                                                    siglen = 10;
                                                    iVar2 = secp256k1_ecdsa_signature_serialize_der
                                                                      (CTX,(uchar *)&keyj,&siglen,
                                                                       &sig);
                                                    if (iVar2 == 0) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_2.d[0] = (uint64_t)
                                                                  (CTX->illegal_callback).fn;
                                                      ss_2.d[1] = (uint64_t)
                                                                  (CTX->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (CTX,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      (*(CTX->illegal_callback).fn)
                                                                ("sigin != NULL",
                                                                 (CTX->illegal_callback).data);
                                                      psVar1 = CTX;
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)ss_2.d[0]
                                                      ;
                                                      (psVar1->illegal_callback).data =
                                                           (void *)ss_2.d[1];
                                                      if (_calls_to_callback_9 == 1) {
                                                        __calls_to_callback_9 =
                                                             __calls_to_callback_9 &
                                                             0xffffffff00000000;
                                                        ss_2.d[0] = (uint64_t)
                                                                    (psVar1->illegal_callback).fn;
                                                        ss_2.d[1] = (uint64_t)
                                                                    (psVar1->illegal_callback).data;
                                                        secp256k1_context_set_illegal_callback
                                                                  (psVar1,counting_callback_fn,
                                                                   &_calls_to_callback_9);
                                                        (*(CTX->illegal_callback).fn)
                                                                  ("output64 != NULL",
                                                                   (CTX->illegal_callback).data);
                                                        psVar1 = CTX;
                                                        (CTX->illegal_callback).fn =
                                                             (_func_void_char_ptr_void_ptr *)
                                                             ss_2.d[0];
                                                        (psVar1->illegal_callback).data =
                                                             (void *)ss_2.d[1];
                                                        if (_calls_to_callback_9 == 1) {
                                                          __calls_to_callback_9 =
                                                               __calls_to_callback_9 &
                                                               0xffffffff00000000;
                                                          ss_2.d[0] = (uint64_t)
                                                                      (psVar1->illegal_callback).fn;
                                                          ss_2.d[1] = (uint64_t)
                                                                      (psVar1->illegal_callback).
                                                                      data;
                                                          secp256k1_context_set_illegal_callback
                                                                    (psVar1,counting_callback_fn,
                                                                     &_calls_to_callback_9);
                                                          (*(CTX->illegal_callback).fn)
                                                                    ("sig != NULL",
                                                                     (CTX->illegal_callback).data);
                                                          psVar1 = CTX;
                                                          (CTX->illegal_callback).fn =
                                                               (_func_void_char_ptr_void_ptr *)
                                                               ss_2.d[0];
                                                          (psVar1->illegal_callback).data =
                                                               (void *)ss_2.d[1];
                                                          if (_calls_to_callback_9 == 1) {
                                                            iVar2 = 
                                                  secp256k1_ecdsa_signature_serialize_compact
                                                            (psVar1,(uchar *)&keyj,&sig);
                                                  if (iVar2 == 0) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1"
                                                  ;
                                                  uVar4 = 0x1c6f;
                                                  }
                                                  else {
                                                    __calls_to_callback_9 =
                                                         __calls_to_callback_9 & 0xffffffff00000000;
                                                    ss_2.d[0] = (uint64_t)(CTX->illegal_callback).fn
                                                    ;
                                                    ss_2.d[1] = (uint64_t)
                                                                (CTX->illegal_callback).data;
                                                    secp256k1_context_set_illegal_callback
                                                              (CTX,counting_callback_fn,
                                                               &_calls_to_callback_9);
                                                    (*(CTX->illegal_callback).fn)
                                                              ("sig != NULL",
                                                               (CTX->illegal_callback).data);
                                                    psVar1 = CTX;
                                                    (CTX->illegal_callback).fn =
                                                         (_func_void_char_ptr_void_ptr *)ss_2.d[0];
                                                    (psVar1->illegal_callback).data =
                                                         (void *)ss_2.d[1];
                                                    if (_calls_to_callback_9 == 1) {
                                                      __calls_to_callback_9 =
                                                           __calls_to_callback_9 &
                                                           0xffffffff00000000;
                                                      ss_2.d[0] = (uint64_t)
                                                                  (psVar1->illegal_callback).fn;
                                                      ss_2.d[1] = (uint64_t)
                                                                  (psVar1->illegal_callback).data;
                                                      secp256k1_context_set_illegal_callback
                                                                (psVar1,counting_callback_fn,
                                                                 &_calls_to_callback_9);
                                                      (*(CTX->illegal_callback).fn)
                                                                ("input64 != NULL",
                                                                 (CTX->illegal_callback).data);
                                                      psVar1 = CTX;
                                                      (CTX->illegal_callback).fn =
                                                           (_func_void_char_ptr_void_ptr *)ss_2.d[0]
                                                      ;
                                                      (psVar1->illegal_callback).data =
                                                           (void *)ss_2.d[1];
                                                      if (_calls_to_callback_9 == 1) {
                                                        iVar2 = 
                                                  secp256k1_ecdsa_signature_parse_compact
                                                            (psVar1,&sig,(uchar *)&keyj);
                                                  if (iVar2 == 0) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1"
                                                  ;
                                                  uVar4 = 0x1c72;
                                                  }
                                                  else {
                                                    keyj.y.n[1]._0_4_ = 0xffffffff;
                                                    keyj.y.n[1]._4_4_ = 0xffffffff;
                                                    keyj.y.n[2]._0_4_ = 0xffffffff;
                                                    keyj.y.n[2]._4_4_ = 0xffffffff;
                                                    keyj.x.n[4] = 0xffffffffffffffff;
                                                    keyj.y.n[0] = 0xffffffffffffffff;
                                                    keyj.x.n[2] = 0xffffffffffffffff;
                                                    keyj.x.n[3] = 0xffffffffffffffff;
                                                    keyj.x.n[0] = 0xffffffffffffffff;
                                                    keyj.x.n[1] = 0xffffffffffffffff;
                                                    iVar2 = secp256k1_ecdsa_signature_parse_compact
                                                                      (CTX,&sig,(uchar *)&keyj);
                                                    if (iVar2 == 0) {
                                                      iVar2 = 0;
                                                      while( true ) {
                                                        lVar9 = 1;
                                                        if (iVar2 == 2) break;
                                                        noncedata = "";
                                                        if (iVar2 == 0) {
                                                          noncedata = (uchar *)0x0;
                                                        }
                                                        ss.d[2] = 0;
                                                        ss.d[3]._0_7_ = 0;
                                                        ss.d[0]._0_1_ = 0;
                                                        ss.d[0]._1_7_ = 0;
                                                        ss.d[1] = 0;
                                                        ss.d[3]._7_1_ = 1;
                                                        sr.d[0]._0_4_ = 0xffffffff;
                                                        sr.d[0]._4_4_ = 0xffffffff;
                                                        sr.d[1]._0_4_ = 0xffffffff;
                                                        sr.d[1]._4_4_ = 0xffffffff;
                                                        sr.d[2]._0_4_ = 0xffffffff;
                                                        sr.d[2]._4_4_ = 0xffffffff;
                                                        sr.d[3]._0_4_ = 0xffffffff;
                                                        sr.d[3]._4_4_ = 0xffffffff;
                                                        iVar3 = secp256k1_ecdsa_sign
                                                                          (CTX,&sig,(uchar *)&ss,
                                                                           (uchar *)&sr,
                                                                           (secp256k1_nonce_function
                                                                           )0x0,noncedata);
                                                        if (iVar3 != 0) {
                                                          pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0"
                                                  ;
                                                  uVar4 = 0x1c85;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = is_empty_signature(&sig);
                                                  if (iVar3 == 0) {
                                                    pcVar7 = 
                                                  "test condition failed: is_empty_signature(&sig)";
                                                  uVar4 = 0x1c86;
                                                  goto LAB_00136123;
                                                  }
                                                  sr.d[2]._0_4_ = 0;
                                                  sr.d[2]._4_4_ = 0;
                                                  sr.d[3]._0_4_ = 0;
                                                  sr.d[3]._4_4_ = 0;
                                                  sr.d[0]._0_4_ = 0;
                                                  sr.d[0]._4_4_ = 0;
                                                  sr.d[1]._0_4_ = 0;
                                                  sr.d[1]._4_4_ = 0;
                                                  iVar3 = secp256k1_ecdsa_sign
                                                                    (CTX,&sig,(uchar *)&ss,
                                                                     (uchar *)&sr,
                                                                     (secp256k1_nonce_function)0x0,
                                                                     noncedata);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0"
                                                  ;
                                                  uVar4 = 0x1c89;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = is_empty_signature(&sig);
                                                  if (iVar3 == 0) {
                                                    pcVar7 = 
                                                  "test condition failed: is_empty_signature(&sig)";
                                                  uVar4 = 0x1c8a;
                                                  goto LAB_00136123;
                                                  }
                                                  sr.d[3]._7_1_ = 1;
                                                  iVar3 = secp256k1_ecdsa_sign
                                                                    (CTX,&sig,(uchar *)&ss,
                                                                     (uchar *)&sr,
                                                                     nonce_function_test_fail,
                                                                     noncedata);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0"
                                                  ;
                                                  uVar4 = 0x1c8d;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = is_empty_signature(&sig);
                                                  if (iVar3 == 0) {
                                                    pcVar7 = 
                                                  "test condition failed: is_empty_signature(&sig)";
                                                  uVar4 = 0x1c8e;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = secp256k1_ecdsa_sign
                                                                    (CTX,&sig,(uchar *)&ss,
                                                                     (uchar *)&sr,
                                                                     nonce_function_test_retry,
                                                                     noncedata);
                                                  if (iVar3 != 1) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1"
                                                  ;
                                                  uVar4 = 0x1c90;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = is_empty_signature(&sig);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: !is_empty_signature(&sig)"
                                                  ;
                                                  uVar4 = 0x1c91;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = secp256k1_ecdsa_sign
                                                                    (CTX,(secp256k1_ecdsa_signature
                                                                          *)&msg,(uchar *)&ss,
                                                                     (uchar *)&sr,
                                                                     nonce_function_rfc6979,
                                                                     noncedata);
                                                  if (iVar3 != 1) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1"
                                                  ;
                                                  uVar4 = 0x1c92;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = is_empty_signature((
                                                  secp256k1_ecdsa_signature *)&msg);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: !is_empty_signature(&sig2)"
                                                  ;
                                                  uVar4 = 0x1c93;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = secp256k1_memcmp_var
                                                                    (&sig,(secp256k1_ecdsa_signature
                                                                           *)&msg,0x40);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0"
                                                  ;
                                                  uVar4 = 0x1c94;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = secp256k1_ecdsa_sign
                                                                    (CTX,(secp256k1_ecdsa_signature
                                                                          *)&msg,(uchar *)&ss,
                                                                     (uchar *)&sr,
                                                                     (secp256k1_nonce_function)0x0,
                                                                     noncedata);
                                                  if (iVar3 != 1) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1"
                                                  ;
                                                  uVar4 = 0x1c96;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = is_empty_signature((
                                                  secp256k1_ecdsa_signature *)&msg);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: !is_empty_signature(&sig2)"
                                                  ;
                                                  uVar4 = 0x1c97;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = secp256k1_memcmp_var
                                                                    (&sig,(secp256k1_ecdsa_signature
                                                                           *)&msg,0x40);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0"
                                                  ;
                                                  uVar4 = 0x1c98;
                                                  goto LAB_00136123;
                                                  }
                                                  for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1)
                                                  {
                                                    ss.d[0]._0_1_ = (undefined1)lVar8;
                                                    iVar3 = secp256k1_ecdsa_sign
                                                                      (CTX,(
                                                  secp256k1_ecdsa_signature *)&msg,(uchar *)&ss,
                                                  (uchar *)&sr,(secp256k1_nonce_function)0x0,
                                                  noncedata);
                                                  if (iVar3 != 1) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1"
                                                  ;
                                                  uVar4 = 0x1c9d;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = is_empty_signature((
                                                  secp256k1_ecdsa_signature *)&msg);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: !is_empty_signature(&sig2)"
                                                  ;
                                                  uVar4 = 0x1c9e;
                                                  goto LAB_00136123;
                                                  }
                                                  puVar5 = keyj.x.n + lVar8 * 4;
                                                  keyj.x.n[lVar8 * 4 + 2] = msg.d[2];
                                                  keyj.y.n[lVar8 * 4 + -2] = msg.d[3];
                                                  *puVar5 = CONCAT44(msg.d[0]._4_4_,(int)msg.d[0]);
                                                  keyj.x.n[lVar8 * 4 + 1] = msg.d[1];
                                                  psVar6 = &keyj;
                                                  lVar10 = lVar9;
                                                  while (lVar10 = lVar10 + -1, lVar10 != 0) {
                                                    iVar3 = secp256k1_scalar_eq((secp256k1_scalar *)
                                                                                puVar5,(
                                                  secp256k1_scalar *)psVar6);
                                                  psVar6 = (secp256k1_gej *)((psVar6->x).n + 4);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: !secp256k1_scalar_eq(&sr[i], &sr[j])"
                                                  ;
                                                  uVar4 = 0x1ca1;
                                                  goto LAB_00136123;
                                                  }
                                                  }
                                                  lVar9 = lVar9 + 1;
                                                  }
                                                  ss.d[0]._0_1_ = 0;
                                                  ss.d[3]._7_1_ = 2;
                                                  lVar9 = 0x101;
                                                  for (lVar8 = 0x100; lVar8 != 0x200;
                                                      lVar8 = lVar8 + 1) {
                                                    sr.d[0]._0_1_ = (char)lVar8;
                                                    iVar3 = secp256k1_ecdsa_sign
                                                                      (CTX,(
                                                  secp256k1_ecdsa_signature *)&msg,(uchar *)&ss,
                                                  (uchar *)&sr,(secp256k1_nonce_function)0x0,
                                                  noncedata);
                                                  if (iVar3 != 1) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1"
                                                  ;
                                                  uVar4 = 0x1caa;
                                                  goto LAB_00136123;
                                                  }
                                                  iVar3 = is_empty_signature((
                                                  secp256k1_ecdsa_signature *)&msg);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: !is_empty_signature(&sig2)"
                                                  ;
                                                  uVar4 = 0x1cab;
                                                  goto LAB_00136123;
                                                  }
                                                  puVar5 = keyj.x.n + lVar8 * 4;
                                                  keyj.x.n[lVar8 * 4 + 2] = msg.d[2];
                                                  keyj.y.n[lVar8 * 4 + -2] = msg.d[3];
                                                  *puVar5 = CONCAT44(msg.d[0]._4_4_,(int)msg.d[0]);
                                                  keyj.x.n[lVar8 * 4 + 1] = msg.d[1];
                                                  psVar6 = &keyj;
                                                  lVar10 = lVar9;
                                                  while (lVar10 = lVar10 + -1, lVar10 != 0) {
                                                    iVar3 = secp256k1_scalar_eq((secp256k1_scalar *)
                                                                                puVar5,(
                                                  secp256k1_scalar *)psVar6);
                                                  psVar6 = (secp256k1_gej *)((psVar6->x).n + 4);
                                                  if (iVar3 != 0) {
                                                    pcVar7 = 
                                                  "test condition failed: !secp256k1_scalar_eq(&sr[i], &sr[j])"
                                                  ;
                                                  uVar4 = 0x1cae;
                                                  goto LAB_00136123;
                                                  }
                                                  }
                                                  lVar9 = lVar9 + 1;
                                                  }
                                                  iVar2 = iVar2 + 1;
                                                  }
                                                  msg.d[2] = 0;
                                                  msg.d[3] = 0;
                                                  msg.d[0]._0_4_ = 0;
                                                  msg.d[0]._4_4_ = 0;
                                                  msg.d[1] = 0;
                                                  ss.d[0]._0_1_ = 0;
                                                  ss.d[0]._1_7_ = 0;
                                                  ss_2.d[0] = 0;
                                                  siglen = 0;
                                                  keyj.x.n[0] = 0x4d430001;
                                                  keyj.x.n[1] = (uint64_t)&siglen;
                                                  keyj.x.n[2] = 0x20;
                                                  keyj.x.n[3] = 0;
                                                  keyj.x.n[4] = 0;
                                                  keyj.y.n[0] = 0;
                                                  __calls_to_callback_9 = 0;
                                                  nonce_function_rfc6979
                                                            ((uchar *)&sr,(uchar *)&msg,
                                                             (uchar *)&msg,(uchar *)0x0,(void *)0x0,
                                                             0);
                                                  keyj.x.n[0] = 0x4d430005;
                                                  keyj.x.n[2] = 0x20;
                                                  keyj.x.n[3] = 0;
                                                  keyj.x.n[4] = 0;
                                                  keyj.y.n[0] = 0;
                                                  __calls_to_callback_9 = 0;
                                                  keyj.x.n[1] = (uint64_t)&sr;
                                                  nonce_function_rfc6979
                                                            ((uchar *)&ss,(uchar *)&msg,
                                                             (uchar *)&msg,(uchar *)&msg,(void *)0x0
                                                             ,0);
                                                  keyj.x.n[0] = 0x4d430005;
                                                  keyj.x.n[2] = 0x20;
                                                  keyj.x.n[3] = 0;
                                                  keyj.x.n[4] = 0;
                                                  keyj.y.n[0] = 0;
                                                  __calls_to_callback_9 = 0;
                                                  keyj.x.n[1] = (uint64_t)&ss;
                                                  nonce_function_rfc6979
                                                            ((uchar *)&ss_2,(uchar *)&msg,
                                                             (uchar *)&msg,(uchar *)0x0,&msg,0);
                                                  keyj.x.n[0] = 0x4d430005;
                                                  keyj.x.n[2] = 0x20;
                                                  keyj.x.n[3] = 0;
                                                  keyj.x.n[4] = 0;
                                                  keyj.y.n[0] = 0;
                                                  __calls_to_callback_9 = 0;
                                                  keyj.x.n[1] = (uint64_t)&ss_2;
                                                  nonce_function_rfc6979
                                                            ((uchar *)&siglen,(uchar *)&msg,
                                                             (uchar *)&msg,(uchar *)&msg,&msg,0);
                                                  keyj.x.n[0] = 0x4d430005;
                                                  keyj.x.n[2] = 0x20;
                                                  keyj.x.n[3] = 0;
                                                  keyj.x.n[4] = 0;
                                                  keyj.y.n[0] = 0;
                                                  __calls_to_callback_9 = 0;
                                                  keyj.x.n[1] = (uint64_t)&siglen;
                                                  iVar2 = secp256k1_memcmp_var(&sr,&ss,0x20);
                                                  if (iVar2 == 0) {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce, nonce2, 32) != 0"
                                                  ;
                                                  uVar4 = 0x1cc7;
                                                  }
                                                  else {
                                                    iVar2 = secp256k1_memcmp_var(&sr,&ss_2,0x20);
                                                    if (iVar2 == 0) {
                                                      pcVar7 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce, nonce3, 32) != 0"
                                                  ;
                                                  uVar4 = 0x1cc8;
                                                  }
                                                  else {
                                                    iVar2 = secp256k1_memcmp_var(&sr,&siglen,0x20);
                                                    if (iVar2 == 0) {
                                                      pcVar7 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce, nonce4, 32) != 0"
                                                  ;
                                                  uVar4 = 0x1cc9;
                                                  }
                                                  else {
                                                    iVar2 = secp256k1_memcmp_var(&ss,&ss_2,0x20);
                                                    if (iVar2 == 0) {
                                                      pcVar7 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce2, nonce3, 32) != 0"
                                                  ;
                                                  uVar4 = 0x1cca;
                                                  }
                                                  else {
                                                    iVar2 = secp256k1_memcmp_var(&ss,&siglen,0x20);
                                                    if (iVar2 == 0) {
                                                      pcVar7 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce2, nonce4, 32) != 0"
                                                  ;
                                                  uVar4 = 0x1ccb;
                                                  }
                                                  else {
                                                    iVar2 = secp256k1_memcmp_var(&ss_2,&siglen,0x20)
                                                    ;
                                                    if (iVar2 == 0) {
                                                      pcVar7 = 
                                                  "test condition failed: secp256k1_memcmp_var(nonce3, nonce4, 32) != 0"
                                                  ;
                                                  uVar4 = 0x1ccc;
                                                  }
                                                  else {
                                                    msg.d[2]._0_1_ = 0xba;
                                                    msg.d[2]._1_1_ = 0xae;
                                                    msg.d[2]._2_1_ = 0xdc;
                                                    msg.d[2]._3_1_ = 0xe6;
                                                    msg.d[2]._4_1_ = 0xaf;
                                                    msg.d[2]._5_1_ = 'H';
                                                    msg.d[2]._6_1_ = 0xa0;
                                                    msg.d[2]._7_1_ = ';';
                                                    msg.d[3]._0_1_ = 0xbf;
                                                    msg.d[3]._1_1_ = 0xd2;
                                                    msg.d[3]._2_1_ = '^';
                                                    msg.d[3]._3_1_ = 0x8c;
                                                    msg.d[3]._4_1_ = 0xd0;
                                                    msg.d[3]._5_1_ = '6';
                                                    msg.d[3]._6_1_ = 'A';
                                                    msg.d[3]._7_1_ = 'A';
                                                    msg.d[0]._0_4_ = -1;
                                                    msg.d[0]._4_4_ = 0xffffffff;
                                                    msg.d[1]._0_1_ = 0xff;
                                                    msg.d[1]._1_1_ = 0xff;
                                                    msg.d[1]._2_1_ = 0xff;
                                                    msg.d[1]._3_1_ = 0xff;
                                                    msg.d[1]._4_1_ = 0xff;
                                                    msg.d[1]._5_1_ = 0xff;
                                                    msg.d[1]._6_1_ = 0xff;
                                                    msg.d[1]._7_1_ = 0xfe;
                                                    iVar2 = ec_privkey_export_der
                                                                      (CTX,(uchar *)&keyj,sr.d,
                                                                       (uchar *)&msg,0);
                                                    if (iVar2 == 0) {
                                                      iVar2 = ec_privkey_export_der
                                                                        (CTX,(uchar *)&keyj,sr.d,
                                                                         (uchar *)&msg,1);
                                                      if (iVar2 == 0) {
                                                        return;
                                                      }
                                                      pcVar7 = 
                                                  "test condition failed: !ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1)"
                                                  ;
                                                  uVar4 = 0x1cdc;
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: !ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0)"
                                                  ;
                                                  uVar4 = 0x1cda;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0"
                                                  ;
                                                  uVar4 = 0x1c74;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar4 = 0x1c71;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar4 = 0x1c70;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar4 = 0x1c6e;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar4 = 0x1c6d;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar4 = 0x1c6c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0"
                                                  ;
                                                  uVar4 = 0x1c6b;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar4 = 0x1c67;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar4 = 0x1c66;
                                                  }
                                                  }
                                                  goto LAB_00136123;
                                                  }
                                                  pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar4 = 0x1c64;
                                                  goto LAB_00136123;
                                                  }
                                                  pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_serialize_der(CTX, signature, ((void*)0), &sig)) == 0"
                                                  ;
                                                  }
                                                  uVar4 = 0x1c63;
                                                  goto LAB_00136123;
                                                  }
                                                  pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: (secp256k1_ecdsa_signature_serialize_der(CTX, ((void*)0), &siglen, &sig)) == 0"
                                                  ;
                                                  }
                                                  uVar4 = 0x1c62;
                                                  goto LAB_00136123;
                                                  }
                                                  pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: (secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey)) == 0"
                                                  ;
                                                  }
                                                  uVar4 = 0x1c60;
                                                  goto LAB_00136123;
                                                  }
                                                  pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: (secp256k1_ec_pubkey_create(CTX, &pubkey, ((void*)0))) == 0"
                                                  ;
                                                  }
                                                  uVar4 = 0x1c5e;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar4 = 0x1c5c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar4 = 0x1c5b;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  uVar4 = 0x1c5a;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1"
                                                  ;
                                                  uVar4 = 0x1c58;
                                                  }
                                                  goto LAB_00136123;
                                                  }
                                                  pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: (secp256k1_ecdsa_sign(CTX, &sig, msg, ((void*)0), precomputed_nonce_function, nonce2)) == 0"
                                                  ;
                                                  }
                                                  uVar4 = 0x1c57;
                                                  goto LAB_00136123;
                                                  }
                                                  pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: (secp256k1_ecdsa_sign(CTX, &sig, ((void*)0), key, precomputed_nonce_function, nonce2)) == 0"
                                                  ;
                                                  }
                                                  uVar4 = 0x1c56;
                                                  goto LAB_00136123;
                                                  }
                                                  pcVar7 = 
                                                  "test condition failed: _calls_to_callback == 1";
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: (secp256k1_ecdsa_sign(CTX, ((void*)0), msg, key, precomputed_nonce_function, nonce2)) == 0"
                                                  ;
                                                  }
                                                  uVar4 = 0x1c55;
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1"
                                                  ;
                                                  uVar4 = 0x1c54;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0"
                                                  ;
                                                  uVar4 = 0x1c52;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0"
                                                  ;
                                                  uVar4 = 0x1c51;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = 
                                                  "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0"
                                                  ;
                                                  uVar4 = 0x1c31;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else {
                                            pcVar7 = 
                                            "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0"
                                            ;
                                            uVar4 = 0x1c12;
                                          }
                                        }
                                        else {
                                          pcVar7 = 
                                          "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0"
                                          ;
                                          uVar4 = 0x1c11;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          else {
                            pcVar7 = 
                            "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0"
                            ;
                            uVar4 = 0x1be8;
                          }
                        }
                        else {
                          pcVar7 = 
                          "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0"
                          ;
                          uVar4 = 0x1be7;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            pcVar7 = "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0";
            uVar4 = 0x1bc5;
          }
        }
      }
      else {
        pcVar7 = "test condition failed: secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0";
        uVar4 = 0x1bb2;
      }
    }
  }
  else {
    pcVar7 = "test condition failed: secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0";
    uVar4 = 0x1b9f;
  }
LAB_00136123:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar4,pcVar7);
  abort();
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, NULL));
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey));
        siglen = 72;
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen));
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL));
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}